

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

long * __thiscall
google::protobuf::RepeatedField<long>::Mutable(RepeatedField<long> *this,int index)

{
  return (long *)((long)index * 8 + (long)this->arena_or_elements_);
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return &elements()[index];
}